

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O2

void __thiscall
duckdb::DuckTransactionManager::CheckpointDecision::CheckpointDecision
          (CheckpointDecision *this,string *reason_p)

{
  this->can_checkpoint = false;
  ::std::__cxx11::string::string((string *)&this->reason,(string *)reason_p);
  return;
}

Assistant:

DuckTransactionManager::CheckpointDecision::CheckpointDecision(string reason_p)
    : can_checkpoint(false), reason(std::move(reason_p)) {
}